

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::checkPoint(PeleLM *this,string *dir,ostream *os,How how,bool dump_old)

{
  int iVar1;
  pointer pcVar2;
  pointer pdVar3;
  long *plVar4;
  void *__s;
  ostream *poVar5;
  size_type *psVar6;
  Real *pRVar7;
  ulong uVar8;
  uint n;
  value_type *__val;
  string tvfile;
  FArrayBox tvfab;
  ofstream tvos;
  string local_2b0;
  undefined1 local_290 [72];
  long *local_248;
  long local_240 [3];
  int aiStack_228 [54];
  ios_base local_150 [268];
  Box local_44;
  
  NavierStokesBase::checkPoint(&this->super_NavierStokesBase,dir,os,how,dump_old);
  if (((this->super_NavierStokesBase).super_AmrLevel.level == 0) &&
     (*(int *)(amrex::ParallelContext::frames + 0xc) == 0)) {
    pcVar2 = (dir->_M_dataplus)._M_p;
    local_248 = local_240 + 1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,pcVar2,pcVar2 + dir->_M_string_length);
    std::__cxx11::string::append((char *)&local_248);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_248,
                                (ulong)typical_values_filename_abi_cxx11_._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_2b0.field_2._M_allocated_capacity = *psVar6;
      local_2b0.field_2._8_8_ = plVar4[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar6;
      local_2b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_2b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_248 != local_240 + 1) {
      operator_delete(local_248,local_240[1] + 1);
    }
    std::ofstream::ofstream(&local_248);
    std::ofstream::open((char *)&local_248,(_Ios_Openmode)local_2b0._M_dataplus._M_p);
    if (*(int *)((long)aiStack_228 + local_248[-3]) != 0) {
      amrex::FileOpenFailed(&local_2b0);
    }
    local_44.bigend.vect._0_8_ = ZEXT48(NavierStokesBase::NUM_STATE - 1);
    local_44.smallend.vect[0] = 0;
    local_44.smallend.vect[1] = 0;
    local_44.smallend.vect[2] = 0;
    local_44.bigend.vect[2] = 0;
    local_44.btype.itype = 0;
    n = (uint)((ulong)((long)typical_values.super_vector<double,_std::allocator<double>_>.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)typical_values.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
    amrex::FArrayBox::FArrayBox((FArrayBox *)local_290,&local_44,n,true,false,(Arena *)0x0);
    pdVar3 = typical_values.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (0 < (int)n) {
      uVar8 = 0;
      do {
        *(double *)(local_290._16_8_ + uVar8 * 8) = pdVar3[uVar8];
        uVar8 = uVar8 + 1;
      } while ((n & 0x7fffffff) != uVar8);
    }
    amrex::FArrayBox::writeOn((FArrayBox *)local_290,(ostream *)&local_248);
    local_290._0_8_ = &PTR__BaseFab_00837b90;
    amrex::BaseFab<double>::clear((BaseFab<double> *)local_290);
    local_248 = _VTT;
    *(undefined8 *)((long)&local_248 + _VTT[-3]) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)local_240);
    std::ios_base::~ios_base(local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (closed_chamber != 0) {
    __s = operator_new(0x200000);
    memset(__s,0,0x200000);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      std::ofstream::ofstream(&local_248);
      (**(code **)(local_240[0] + 0x18))((filebuf *)local_240,__s,0x200000);
      pcVar2 = (dir->_M_dataplus)._M_p;
      local_290._0_8_ = local_290 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_290,pcVar2,pcVar2 + dir->_M_string_length);
      std::__cxx11::string::append(local_290);
      std::ofstream::open((char *)&local_248,(_Ios_Openmode)local_290._0_8_);
      if (*(int *)((long)aiStack_228 + local_248[-3]) != 0) {
        amrex::FileOpenFailed((string *)local_290);
      }
      *(undefined8 *)((long)local_240 + local_248[-3]) = 0x11;
      iVar1 = *(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_248,"Writing p_amb to checkpoint\n",0x1c);
      pRVar7 = &p_amb_new;
      if (iVar1 == 0) {
        pRVar7 = &p_amb_old;
      }
      poVar5 = std::ostream::_M_insert<double>(*pRVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
      local_248 = _VTT;
      *(undefined8 *)((long)&local_248 + _VTT[-3]) = __M_insert<void_const*>;
      std::filebuf::~filebuf((filebuf *)local_240);
      std::ios_base::~ios_base(local_150);
    }
    operator_delete(__s,0x200000);
  }
  return;
}

Assistant:

void
PeleLM::checkPoint (const std::string& dir,
                    std::ostream&      os,
                    VisMF::How         how,
                    bool               dump_old)
{
  NavierStokesBase::checkPoint(dir,os,how,dump_old);

  if (level == 0)
  {
    if (ParallelDescriptor::IOProcessor())
    {
      const std::string tvfile = dir + "/" + typical_values_filename;
      std::ofstream tvos;
      tvos.open(tvfile.c_str(),std::ios::out|std::ios::trunc|std::ios::binary);
      if (!tvos.good())
        amrex::FileOpenFailed(tvfile);
      Box tvbox(IntVect(),(NUM_STATE-1)*amrex::BASISV(0));
      int nComp = typical_values.size();
      FArrayBox tvfab(tvbox,nComp);
      for (int i=0; i<nComp; ++i) {
        tvfab.dataPtr()[i] = typical_values[i];
      }
      tvfab.writeOn(tvos);
    }
  }

  if (closed_chamber) {

      VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);

      if (ParallelDescriptor::IOProcessor()) {

          std::ofstream PAMBFile;
          PAMBFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
          std::string PAMBFileName(dir + "/PAMB");
          PAMBFile.open(PAMBFileName.c_str(), std::ofstream::out   |
                        std::ofstream::trunc |
                        std::ofstream::binary);

          if( !PAMBFile.good()) {
              amrex::FileOpenFailed(PAMBFileName);
          }

          PAMBFile.precision(17);

          int step = parent->levelSteps(0);

          // write out title line
          PAMBFile << "Writing p_amb to checkpoint\n";
          if (step == 0) {
              PAMBFile << p_amb_old << "\n";
          }
          else {
              PAMBFile << p_amb_new << "\n";
          }
      }
  }
}